

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::line_end(Fl_Input_ *this,int i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  bool bVar5;
  char local_428 [4];
  int k;
  char buf [1024];
  char *p;
  int j;
  int i_local;
  Fl_Input_ *this_local;
  
  iVar1 = input_type(this);
  if (iVar1 == 4) {
    iVar1 = wrap(this);
    uVar4 = extraout_RDX;
    p._0_4_ = i;
    p._4_4_ = i;
    if (iVar1 == 0) {
      while( true ) {
        iVar1 = size(this);
        bVar5 = false;
        if ((int)p._4_4_ < iVar1) {
          pcVar2 = index(this,(char *)(ulong)p._4_4_,iVar1);
          bVar5 = (int)pcVar2 != 10;
        }
        if (!bVar5) break;
        p._4_4_ = p._4_4_ + 1;
      }
      this_local._4_4_ = p._4_4_;
    }
    else {
      while( true ) {
        bVar5 = false;
        if (0 < (int)p) {
          pcVar2 = index(this,(char *)(ulong)((int)p - 1),(int)uVar4);
          bVar5 = (int)pcVar2 != 10;
          uVar4 = extraout_RDX_00;
        }
        if (!bVar5) break;
        p._0_4_ = (int)p + -1;
      }
      setfont(this);
      pcVar2 = value(this);
      buf._1016_8_ = pcVar2 + (int)p;
      while( true ) {
        pcVar2 = expand(this,(char *)buf._1016_8_,local_428);
        buf._1016_8_ = pcVar2;
        pcVar3 = value(this);
        this_local._4_4_ = (int)pcVar2 - (int)pcVar3;
        if (i <= (int)this_local._4_4_) break;
        buf._1016_8_ = buf._1016_8_ + 1;
      }
    }
  }
  else {
    this_local._4_4_ = size(this);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::line_end(int i) const {
  if (input_type() != FL_MULTILINE_INPUT) return size();

  if (wrap()) {
    // go to the start of the paragraph:
    int j = i;
    while (j > 0 && index(j-1) != '\n') j--;
    // now measure lines until we get past i, end of that line is real eol:
    setfont();
    for (const char* p=value()+j; ;) {
      char buf[MAXBUF];
      p = expand(p, buf);
      int k = (int) (p-value());
      if (k >= i) return k;
      p++;
    }
  } else {
    while (i < size() && index(i) != '\n') i++;
    return i;
  }
}